

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu.c
# Opt level: O2

int byte_alignment(AV1_COMMON *cm,aom_read_bit_buffer *rb)

{
  int iVar1;
  
  do {
    if ((rb->bit_offset & 7) == 0) {
      return 0;
    }
    iVar1 = aom_rb_read_bit(rb);
  } while (iVar1 == 0);
  cm->error->error_code = AOM_CODEC_CORRUPT_FRAME;
  return -1;
}

Assistant:

static int byte_alignment(AV1_COMMON *const cm,
                          struct aom_read_bit_buffer *const rb) {
  while (rb->bit_offset & 7) {
    if (aom_rb_read_bit(rb)) {
      cm->error->error_code = AOM_CODEC_CORRUPT_FRAME;
      return -1;
    }
  }
  return 0;
}